

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSAtom js_atom_concat_str(JSContext *ctx,JSAtom name,char *str1)

{
  int iVar1;
  JSAtom JVar2;
  char *pcVar3;
  size_t __n;
  JSRefCountHeader *p;
  JSValueUnion JVar4;
  uint uVar5;
  JSValue JVar6;
  size_t len;
  size_t local_48;
  char *local_40;
  JSValueUnion local_38;
  
  JVar6 = __JS_AtomToValue(ctx,name,1);
  uVar5 = (uint)JVar6.tag;
  if (uVar5 == 6) {
    return 0;
  }
  pcVar3 = JS_ToCStringLen2(ctx,&local_48,JVar6,0);
  JVar4 = JVar6.u;
  if (pcVar3 != (char *)0x0) {
    local_40 = pcVar3;
    local_38 = JVar6.u;
    __n = strlen(str1);
    pcVar3 = (char *)js_malloc(ctx,__n + local_48 + 1);
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3,local_40,local_48);
      memcpy(pcVar3 + local_48,str1,__n);
      pcVar3[__n + local_48] = '\0';
      JVar2 = JS_NewAtomLen(ctx,pcVar3,__n + local_48);
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar3);
      JS_FreeCString(ctx,local_40);
      if (uVar5 < 0xfffffff5) {
        return JVar2;
      }
      iVar1 = *local_38.ptr;
      *(int *)local_38.ptr = iVar1 + -1;
      JVar4 = local_38;
      if (1 < iVar1) {
        return JVar2;
      }
      goto LAB_0015a680;
    }
    JS_FreeCString(ctx,local_40);
    JVar4 = local_38;
  }
  if (uVar5 < 0xfffffff5) {
    return 0;
  }
  iVar1 = *JVar4.ptr;
  *(int *)JVar4.ptr = iVar1 + -1;
  if (1 < iVar1) {
    return 0;
  }
  JVar2 = 0;
LAB_0015a680:
  JVar6.u.ptr = JVar4.ptr;
  __JS_FreeValueRT(ctx->rt,JVar6);
  return JVar2;
}

Assistant:

static JSAtom js_atom_concat_str(JSContext *ctx, JSAtom name, const char *str1)
{
    JSValue str;
    JSAtom atom;
    const char *cstr;
    char *cstr2;
    size_t len, len1;
    
    str = JS_AtomToString(ctx, name);
    if (JS_IsException(str))
        return JS_ATOM_NULL;
    cstr = JS_ToCStringLen(ctx, &len, str);
    if (!cstr)
        goto fail;
    len1 = strlen(str1);
    cstr2 = js_malloc(ctx, len + len1 + 1);
    if (!cstr2)
        goto fail;
    memcpy(cstr2, cstr, len);
    memcpy(cstr2 + len, str1, len1);
    cstr2[len + len1] = '\0';
    atom = JS_NewAtomLen(ctx, cstr2, len + len1);
    js_free(ctx, cstr2);
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return atom;
 fail:
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return JS_ATOM_NULL;
}